

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O3

void and_or_test(void)

{
  ushort uVar1;
  _Bool _Var2;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *out;
  uint16_t *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  unsigned_long uVar9;
  int iVar10;
  ushort uVar11;
  int32_t iVar12;
  bool bVar13;
  
  fprintf(_stderr,"--- %s\n","and_or_test");
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  out = array_container_create();
  _assert_true((unsigned_long)container,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x61);
  _assert_true((unsigned_long)container_00,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x62);
  _assert_true((unsigned_long)container_01,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,99);
  _assert_true((unsigned_long)container_02,"BO",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,100);
  _assert_true((unsigned_long)out,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x65);
  uVar7 = 0;
  do {
    iVar10 = container->cardinality;
    uVar11 = (ushort)uVar7;
    if (((long)iVar10 == 0) ||
       ((puVar3 = container->array, iVar10 != 0x7fffffff && (puVar3[(long)iVar10 + -1] < uVar11))))
    {
      if (iVar10 == container->capacity) {
        array_container_grow(container,iVar10 + 1,true);
        iVar10 = container->cardinality;
      }
      container->cardinality = iVar10 + 1;
      container->array[iVar10] = uVar11;
    }
    else {
      if (iVar10 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar10 + -1;
        uVar6 = 0;
        do {
          uVar8 = iVar5 + (int)uVar6;
          uVar4 = uVar8 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar6 = (ulong)(uVar4 + 1);
          }
          else {
            if (uVar1 <= uVar11) goto LAB_0010244f;
            iVar5 = uVar4 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        if (iVar10 == 0x7fffffff) goto LAB_0010244f;
      }
      if (iVar10 == container->capacity) {
        array_container_grow(container,iVar10 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar6 + 1,puVar3 + uVar6,(long)(iVar10 - (int)uVar6) * 2);
      container->array[uVar6] = uVar11;
      container->cardinality = container->cardinality + 1;
    }
LAB_0010244f:
    iVar10 = container_01->cardinality;
    if (((long)iVar10 == 0) ||
       ((puVar3 = container_01->array, iVar10 != 0x7fffffff && (puVar3[(long)iVar10 + -1] < uVar11))
       )) {
      if (iVar10 == container_01->capacity) {
        array_container_grow(container_01,iVar10 + 1,true);
        iVar10 = container_01->cardinality;
      }
      container_01->cardinality = iVar10 + 1;
      container_01->array[iVar10] = uVar11;
    }
    else {
      if (iVar10 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar10 + -1;
        uVar6 = 0;
        do {
          uVar8 = iVar5 + (int)uVar6;
          uVar4 = uVar8 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar6 = (ulong)(uVar4 + 1);
          }
          else {
            if (uVar1 <= uVar11) goto LAB_0010251f;
            iVar5 = uVar4 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        if (iVar10 == 0x7fffffff) goto LAB_0010251f;
      }
      if (iVar10 == container_01->capacity) {
        array_container_grow(container_01,iVar10 + 1,true);
        puVar3 = container_01->array;
      }
      memmove(puVar3 + uVar6 + 1,puVar3 + uVar6,(long)(iVar10 - (int)uVar6) * 2);
      container_01->array[uVar6] = uVar11;
      container_01->cardinality = container_01->cardinality + 1;
    }
LAB_0010251f:
    bVar13 = uVar7 < 0xffef;
    uVar7 = uVar7 + 0x11;
  } while (bVar13);
  uVar7 = 0;
  do {
    iVar10 = container_00->cardinality;
    uVar11 = (ushort)uVar7;
    if (((long)iVar10 == 0) ||
       ((puVar3 = container_00->array, iVar10 != 0x7fffffff && (puVar3[(long)iVar10 + -1] < uVar11))
       )) {
      if (iVar10 == container_00->capacity) {
        array_container_grow(container_00,iVar10 + 1,true);
        iVar10 = container_00->cardinality;
      }
      container_00->cardinality = iVar10 + 1;
      container_00->array[iVar10] = uVar11;
    }
    else {
      if (iVar10 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar10 + -1;
        uVar6 = 0;
        do {
          uVar8 = iVar5 + (int)uVar6;
          uVar4 = uVar8 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar6 = (ulong)(uVar4 + 1);
          }
          else {
            if (uVar1 <= uVar11) goto LAB_00102611;
            iVar5 = uVar4 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        if (iVar10 == 0x7fffffff) goto LAB_00102611;
      }
      if (iVar10 == container_00->capacity) {
        array_container_grow(container_00,iVar10 + 1,true);
        puVar3 = container_00->array;
      }
      memmove(puVar3 + uVar6 + 1,puVar3 + uVar6,(long)(iVar10 - (int)uVar6) * 2);
      container_00->array[uVar6] = uVar11;
      container_00->cardinality = container_00->cardinality + 1;
    }
LAB_00102611:
    iVar10 = container_01->cardinality;
    if (((long)iVar10 == 0) ||
       ((puVar3 = container_01->array, iVar10 != 0x7fffffff && (puVar3[(long)iVar10 + -1] < uVar11))
       )) {
      if (iVar10 == container_01->capacity) {
        array_container_grow(container_01,iVar10 + 1,true);
        iVar10 = container_01->cardinality;
      }
      container_01->cardinality = iVar10 + 1;
      container_01->array[iVar10] = uVar11;
    }
    else {
      if (iVar10 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar10 + -1;
        uVar6 = 0;
        do {
          uVar8 = iVar5 + (int)uVar6;
          uVar4 = uVar8 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar6 = (ulong)(uVar4 + 1);
          }
          else {
            if (uVar1 <= uVar11) goto LAB_001026e5;
            iVar5 = uVar4 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        if (iVar10 == 0x7fffffff) goto LAB_001026e5;
      }
      if (iVar10 == container_01->capacity) {
        array_container_grow(container_01,iVar10 + 1,true);
        puVar3 = container_01->array;
      }
      memmove(puVar3 + uVar6 + 1,puVar3 + uVar6,(long)(iVar10 - (int)uVar6) * 2);
      container_01->array[uVar6] = uVar11;
      container_01->cardinality = container_01->cardinality + 1;
    }
LAB_001026e5:
    bVar13 = uVar7 < 0xffc2;
    uVar7 = uVar7 + 0x3e;
  } while (bVar13);
  iVar10 = container_02->cardinality;
  uVar7 = 0;
  iVar12 = iVar10;
  do {
    uVar11 = (ushort)uVar7;
    if ((iVar12 == 0) ||
       ((puVar3 = container_02->array, iVar12 != 0x7fffffff && (puVar3[(long)iVar12 + -1] < uVar11))
       )) {
      if (iVar12 == container_02->capacity) {
        array_container_grow(container_02,iVar12 + 1,true);
        iVar12 = container_02->cardinality;
      }
      iVar10 = iVar12 + 1;
      container_02->cardinality = iVar10;
      container_02->array[iVar12] = uVar11;
      iVar5 = iVar10;
    }
    else {
      if (iVar12 < 1) {
        uVar6 = 0;
      }
      else {
        iVar5 = iVar12 + -1;
        uVar6 = 0;
        do {
          uVar8 = iVar5 + (int)uVar6;
          uVar4 = uVar8 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffe));
          if (uVar1 < uVar11) {
            uVar6 = (ulong)(uVar4 + 1);
          }
          else {
            iVar5 = iVar12;
            if (uVar1 <= uVar11) goto LAB_001027e8;
            iVar5 = uVar4 - 1;
          }
        } while ((int)uVar6 <= iVar5);
        iVar5 = 0x7fffffff;
        if (iVar12 == 0x7fffffff) goto LAB_001027e8;
      }
      if (iVar12 == container_02->capacity) {
        array_container_grow(container_02,iVar12 + 1,true);
        puVar3 = container_02->array;
      }
      memmove(puVar3 + uVar6 + 1,puVar3 + uVar6,(long)(iVar12 - (int)uVar6) * 2);
      container_02->array[uVar6] = uVar11;
      iVar10 = container_02->cardinality + 1;
      container_02->cardinality = iVar10;
      iVar5 = iVar10;
    }
LAB_001027e8:
    iVar12 = iVar5;
    bVar13 = 0xfbe1 < uVar7;
    uVar7 = uVar7 + 0x41e;
    if (bVar13) {
      iVar5 = container_01->cardinality;
      array_container_intersection(container,container_00,out);
      _assert_int_equal((long)iVar10,(long)out->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                        ,0x7a);
      if (container_02->cardinality == out->cardinality) {
        _Var2 = memequals(container_02->array,out->array,(long)container_02->cardinality * 2);
        uVar9 = (unsigned_long)_Var2;
      }
      else {
        uVar9 = 0;
      }
      _assert_true(uVar9,"array_container_equals(BO, TMP)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                   ,0x7b);
      array_container_union(container,container_00,out);
      _assert_int_equal((long)iVar5,(long)out->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                        ,0x7e);
      if (container_01->cardinality == out->cardinality) {
        _Var2 = memequals(container_01->array,out->array,(long)container_01->cardinality * 2);
        uVar9 = (unsigned_long)_Var2;
      }
      else {
        uVar9 = 0;
      }
      _assert_true(uVar9,"array_container_equals(BI, TMP)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                   ,0x7f);
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_02);
      array_container_free(out);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(and_or_test) {
    DESCRIBE_TEST;

    array_container_t* B1 = array_container_create();
    array_container_t* B2 = array_container_create();
    array_container_t* BI = array_container_create();
    array_container_t* BO = array_container_create();
    array_container_t* TMP = array_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 17) {
        array_container_add(B1, x);
        array_container_add(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        array_container_add(B2, x);
        array_container_add(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 17) {
        array_container_add(BO, x);
    }

    const int card_inter = array_container_cardinality(BO);
    const int card_union = array_container_cardinality(BI);

    array_container_intersection(B1, B2, TMP);
    assert_int_equal(card_inter, array_container_cardinality(TMP));
    assert_true(array_container_equals(BO, TMP));

    array_container_union(B1, B2, TMP);
    assert_int_equal(card_union, array_container_cardinality(TMP));
    assert_true(array_container_equals(BI, TMP));

    array_container_free(B1);
    array_container_free(B2);
    array_container_free(BI);
    array_container_free(BO);
    array_container_free(TMP);
}